

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

int pybind11_set_dict(PyObject *self,PyObject *new_dict,void *param_3)

{
  PyObject *op;
  int iVar1;
  undefined8 *puVar2;
  PyObject *_py_tmp;
  PyObject **dict;
  void *param_2_local;
  PyObject *new_dict_local;
  PyObject *self_local;
  
  iVar1 = PyType_HasFeature(new_dict->ob_type,0x20000000);
  if (iVar1 == 0) {
    PyErr_Format(_PyExc_TypeError,"__dict__ must be set to a dictionary, not a \'%.200s\'",
                 new_dict->ob_type->tp_name);
    self_local._4_4_ = -1;
  }
  else {
    puVar2 = (undefined8 *)_PyObject_GetDictPtr(self);
    _Py_INCREF(new_dict);
    op = (PyObject *)*puVar2;
    if (op != (PyObject *)0x0) {
      *puVar2 = 0;
      _Py_DECREF(op);
    }
    *puVar2 = new_dict;
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

inline int pybind11_set_dict(PyObject *self, PyObject *new_dict, void *) {
    if (!PyDict_Check(new_dict)) {
        PyErr_Format(PyExc_TypeError, "__dict__ must be set to a dictionary, not a '%.200s'",
                     Py_TYPE(new_dict)->tp_name);
        return -1;
    }
    PyObject *&dict = *_PyObject_GetDictPtr(self);
    Py_INCREF(new_dict);
    Py_CLEAR(dict);
    dict = new_dict;
    return 0;
}